

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O1

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  char cVar1;
  int in_EAX;
  int extraout_EAX;
  uint uVar2;
  undefined1 *puVar3;
  long lVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  uchar chain [16];
  uchar key [32];
  uchar tmp [48];
  uchar buf [416];
  mbedtls_aes_context aes_ctx;
  undefined8 local_368;
  undefined8 uStack_360;
  uchar *local_358;
  ulong local_350;
  uchar local_348 [32];
  uchar local_328 [8];
  undefined8 auStack_320 [3];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [3];
  char local_2f5;
  undefined2 local_2e8;
  undefined1 local_2e6;
  undefined1 local_2e5;
  undefined1 local_2e1;
  undefined1 local_2e0 [400];
  mbedtls_aes_context local_150;
  
  if (data_len < 0x181) {
    lVar4 = 0;
    local_358 = output;
    memset(local_2f8,0,0x1a0);
    mbedtls_aes_init(&local_150);
    local_2e8 = 0;
    local_2e6 = (undefined1)(data_len >> 8);
    local_2e5 = (undefined1)data_len;
    local_2e1 = 0x30;
    memcpy(local_2e0,data,data_len);
    local_2e0[data_len] = 0x80;
    do {
      local_348[lVar4] = (uchar)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    mbedtls_aes_setkey_enc(&local_150,local_348,0x100);
    uVar6 = 0;
    local_350 = data_len + 0x19;
    do {
      cVar1 = local_2f5;
      local_368 = 0;
      uStack_360 = 0;
      puVar3 = local_2f8;
      uVar7 = local_350;
      do {
        lVar4 = 0;
        do {
          *(byte *)((long)&local_368 + lVar4) = *(byte *)((long)&local_368 + lVar4) ^ puVar3[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        puVar3 = puVar3 + 0x10;
        mbedtls_aes_crypt_ecb(&local_150,1,(uchar *)&local_368,(uchar *)&local_368);
        bVar8 = 0xf < uVar7;
        uVar7 = uVar7 - 0x10;
        bVar9 = uVar7 != 0;
        if (!bVar8) {
          uVar7 = 0;
        }
      } while (bVar8 && bVar9);
      *(undefined8 *)((long)auStack_320 + (uVar6 - 8)) = local_368;
      *(undefined8 *)((long)auStack_320 + uVar6) = uStack_360;
      local_2f5 = cVar1 + '\x01';
      bVar8 = uVar6 < 0x20;
      uVar6 = uVar6 + 0x10;
    } while (bVar8);
    mbedtls_aes_setkey_enc(&local_150,local_328,0x100);
    uVar2 = 0xfffffff0;
    puVar5 = local_358;
    do {
      mbedtls_aes_crypt_ecb(&local_150,1,(uchar *)&local_308,(uchar *)&local_308);
      *(undefined8 *)puVar5 = local_308;
      *(undefined8 *)(puVar5 + 8) = uStack_300;
      puVar5 = puVar5 + 0x10;
      uVar2 = uVar2 + 0x10;
    } while (uVar2 < 0x20);
    mbedtls_aes_free(&local_150);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    mbedtls_aes_setkey_enc( &aes_ctx, key, MBEDTLS_CTR_DRBG_KEYBITS );

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, chain, chain );
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    mbedtls_aes_setkey_enc( &aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS );
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, iv, iv );
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    mbedtls_aes_free( &aes_ctx );

    return( 0 );
}